

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
::WorkerQueue(WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args)

{
  WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
  *this_00;
  bool bVar1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_60;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  type local_50;
  condition_variable *local_48;
  WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
  *local_40;
  WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
  *local_38;
  
  local_60 = args;
  std::_Deque_base<std::thread,_std::allocator<std::thread>_>::_Deque_base
            ((_Deque_base<std::thread,_std::allocator<std::thread>_> *)this);
  local_48 = (condition_variable *)(this + 0x50);
  std::condition_variable::condition_variable(local_48);
  *(undefined4 *)(this + 0xac) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0x99) = 0;
  *(undefined8 *)(this + 0xa1) = 0;
  std::
  queue<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>>
  ::
  queue<std::deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>,void>
            ((queue<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::allocator<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>_>_>
              *)(this + 0xb0));
  this_00 = this + 0x110;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  local_40 = this + 0xb0;
  std::
  _Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::_Deque_base((_Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                 *)this_00);
  local_38 = this_00;
  if (numWorkers < 1) {
    numWorkers = std::thread::hardware_concurrency();
  }
  while (bVar1 = numWorkers != 0, numWorkers = numWorkers + -1, bVar1) {
    local_50.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<ReadMergerWorker<DNA>,std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*>::WorkerQueue(int,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*)::_lambda(WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*&&)_1_,WorkerQueue<MergedReadWriterWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::__cxx11::string_const&>*&,void>
              ((thread *)&args_local,&local_50,&local_60);
    std::deque<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,(thread *)&args_local);
    std::thread::~thread((thread *)&args_local);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }